

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O0

int __thiscall QTextTableCell::tableCellFormatIndex(QTextTableCell *this)

{
  QTextDocumentPrivate *this_00;
  FragmentMap *p_00;
  QTextFragmentData *pQVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QTextDocumentPrivate *p;
  ConstIterator local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QTextDocumentPrivate::get((QTextObject *)0x89494d);
  p_00 = QTextDocumentPrivate::fragmentMap(this_00);
  QFragmentMap<QTextFragmentData>::ConstIterator::ConstIterator(&local_18,p_00,*(int *)(in_RDI + 8))
  ;
  pQVar1 = QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x894980);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1->format;
  }
  __stack_chk_fail();
}

Assistant:

int QTextTableCell::tableCellFormatIndex() const
{
    const QTextDocumentPrivate *p = QTextDocumentPrivate::get(table);
    return QTextDocumentPrivate::FragmentIterator(&p->fragmentMap(), fragment)->format;
}